

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testValidateNewOrderSingle(int count)

{
  Header *this;
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  TransactTime transactTime;
  Side side;
  Symbol symbol;
  HandlInst handlInst;
  ClOrdID clOrdID;
  OrdType ordType;
  DataDictionary dataDictionary;
  NewOrderSingle message;
  allocator<char> local_7c1;
  STRING local_7c0;
  FieldBase local_7a0;
  FieldBase local_740;
  FieldBase local_6e0;
  FieldBase local_680;
  FieldBase local_620;
  FieldBase local_5c0;
  FieldBase local_560 [10];
  undefined1 local_178 [344];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_560,"ORDERID",(allocator<char> *)local_178);
  FIX::ClOrdID::ClOrdID((ClOrdID *)&local_620,(STRING *)local_560);
  std::__cxx11::string::~string((string *)local_560);
  local_560[0]._vptr_FieldBase._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_680,(CHAR *)local_560);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_560,"LNUX",(allocator<char> *)local_178);
  FIX::Symbol::Symbol((Symbol *)&local_6e0,(STRING *)local_560);
  std::__cxx11::string::~string((string *)local_560);
  FIX::Side::Side((Side *)&local_740,"11");
  FIX::TransactTime::TransactTime((TransactTime *)&local_7a0);
  FIX::OrdType::OrdType((OrdType *)&local_5c0,"1");
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)local_178,(ClOrdID *)&local_620,(HandlInst *)&local_680,
             (Symbol *)&local_6e0,(Side *)&local_740,(TransactTime *)&local_7a0,
             (OrdType *)&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"SENDER",&local_7c1);
  FIX::SenderCompID::SenderCompID((SenderCompID *)local_560,&local_7c0);
  this = (Header *)(local_178 + 0x70);
  FIX42::Header::set(this,(SenderCompID *)local_560);
  FIX::FieldBase::~FieldBase(local_560);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"TARGET",&local_7c1);
  FIX::TargetCompID::TargetCompID((TargetCompID *)local_560,&local_7c0);
  FIX42::Header::set(this,(TargetCompID *)local_560);
  FIX::FieldBase::~FieldBase(local_560);
  std::__cxx11::string::~string((string *)&local_7c0);
  local_7c0._M_dataplus._M_p._0_4_ = 1;
  FIX::MsgSeqNum::MsgSeqNum((MsgSeqNum *)local_560,(SEQNUM *)&local_7c0);
  FIX42::Header::set(this,(MsgSeqNum *)local_560);
  FIX::FieldBase::~FieldBase(local_560);
  FIX::DataDictionary::DataDictionary((DataDictionary *)local_560);
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < count) {
    iVar3 = count;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::DataDictionary::validate((DataDictionary *)local_560,(Message *)local_178);
  }
  lVar2 = GetTickCount();
  FIX::DataDictionary::~DataDictionary((DataDictionary *)local_560);
  FIX::Message::~Message((Message *)local_178);
  FIX::FieldBase::~FieldBase(&local_5c0);
  FIX::FieldBase::~FieldBase(&local_7a0);
  FIX::FieldBase::~FieldBase(&local_740);
  FIX::FieldBase::~FieldBase(&local_6e0);
  FIX::FieldBase::~FieldBase(&local_680);
  FIX::FieldBase::~FieldBase(&local_620);
  return lVar2 - lVar1;
}

Assistant:

long testValidateNewOrderSingle( int count )
{
  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message
  ( clOrdID, handlInst, symbol, side, transactTime, ordType );
  message.getHeader().set( FIX::SenderCompID( "SENDER" ) );
  message.getHeader().set( FIX::TargetCompID( "TARGET" ) );
  message.getHeader().set( FIX::MsgSeqNum( 1 ) );

  FIX::DataDictionary dataDictionary;
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    dataDictionary.validate( message );
  }
  return GetTickCount() - start;
}